

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O2

bool __thiscall
google::protobuf::MessageLite::AppendPartialToString(MessageLite *this,string *output)

{
  size_type sVar1;
  int size;
  undefined4 extraout_var;
  LogMessage *pLVar2;
  LogFinisher local_79;
  string local_78;
  LogMessage local_58;
  ulong value;
  
  sVar1 = output->_M_string_length;
  size = (*this->_vptr_MessageLite[8])();
  value = CONCAT44(extraout_var,size);
  if ((value & 0xffffffff80000000) == 0) {
    STLStringResizeUninitializedAmortized(output,value + sVar1);
    SerializeToArrayImpl(this,(uint8_t *)((output->_M_dataplus)._M_p + sVar1),size);
  }
  else {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_ERROR,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/message_lite.cc"
               ,0x1c2);
    (*this->_vptr_MessageLite[2])(&local_78,this);
    pLVar2 = internal::LogMessage::operator<<(&local_58,&local_78);
    pLVar2 = internal::LogMessage::operator<<(pLVar2," exceeded maximum protobuf size of 2GB: ");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,value);
    internal::LogFinisher::operator=(&local_79,pLVar2);
    std::__cxx11::string::~string((string *)&local_78);
    internal::LogMessage::~LogMessage(&local_58);
  }
  return value >> 0x1f == 0;
}

Assistant:

bool MessageLite::AppendPartialToString(std::string* output) const {
  size_t old_size = output->size();
  size_t byte_size = ByteSizeLong();
  if (byte_size > INT_MAX) {
    GOOGLE_LOG(ERROR) << GetTypeName()
               << " exceeded maximum protobuf size of 2GB: " << byte_size;
    return false;
  }

  STLStringResizeUninitializedAmortized(output, old_size + byte_size);
  uint8_t* start =
      reinterpret_cast<uint8_t*>(io::mutable_string_data(output) + old_size);
  SerializeToArrayImpl(*this, start, byte_size);
  return true;
}